

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

int __thiscall
QDomNamedNodeMapPrivate::clone
          (QDomNamedNodeMapPrivate *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  __uniq_ptr_impl<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> _Var1;
  int iVar2;
  tuple<QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_> this_00;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  const_iterator local_58;
  __uniq_ptr_impl<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> local_38;
  long local_30;
  QDomNodePrivate *arg;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00.
  super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>.
  super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>)
       operator_new(0x28);
  *(undefined4 *)
   this_00.
   super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>.
   super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl = 1;
  ((QMultiHash<QString,_QDomNodePrivate_*> *)
  ((long)this_00.
         super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
         .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl + 8))->d =
       (Data *)0x0;
  *(qsizetype *)
   ((long)this_00.
          super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
          .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl + 0x10) = 0;
  *(__fn **)((long)this_00.
                   super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
                   .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl + 0x18) =
       __fn;
  *(bool *)((long)this_00.
                  super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
                  .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl + 0x20) =
       this->readonly;
  *(bool *)((long)this_00.
                  super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
                  .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl + 0x21) =
       this->appendToParent;
  local_58.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
  local_58.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)&DAT_aaaaaaaaaaaaaaaa
  ;
  local_58.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
  local_38._M_t.
  super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>.
  super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl =
       (tuple<QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>)
       (tuple<QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>)
       this_00.
       super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
       .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl;
  QMultiHash<QString,_QDomNodePrivate_*>::constBegin(&local_58,&this->map);
  while (_Var1._M_t.
         super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
         .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl =
              (tuple<QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>)
              (tuple<QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>)
              local_38, local_58.e != (Chain **)0x0) {
    iVar2 = (*(*local_58.e)->value->_vptr_QDomNodePrivate[8])((*local_58.e)->value,1);
    arg = (QDomNodePrivate *)CONCAT44(extraout_var,iVar2);
    arg->ownerNode = (QDomNodePrivate *)__fn;
    arg->field_0x98 = arg->field_0x98 | 2;
    setNamedItem((QDomNamedNodeMapPrivate *)
                 this_00.
                 super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
                 .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl,arg);
    QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator++(&local_58);
  }
  LOCK();
  *(int *)this_00.
          super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
          .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl =
       *(int *)this_00.
               super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
               .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl + -1;
  UNLOCK();
  local_38._M_t.
  super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>.
  super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl =
       (tuple<QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>)
       (_Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>)
       0x0;
  std::unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_>::
  ~unique_ptr((unique_ptr<QDomNamedNodeMapPrivate,_std::default_delete<QDomNamedNodeMapPrivate>_> *)
              &local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)_Var1._M_t.
                super__Tuple_impl<0UL,_QDomNamedNodeMapPrivate_*,_std::default_delete<QDomNamedNodeMapPrivate>_>
                .super__Head_base<0UL,_QDomNamedNodeMapPrivate_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

QDomNamedNodeMapPrivate* QDomNamedNodeMapPrivate::clone(QDomNodePrivate *pimpl)
{
    std::unique_ptr<QDomNamedNodeMapPrivate> m(new QDomNamedNodeMapPrivate(pimpl));
    m->readonly = readonly;
    m->appendToParent = appendToParent;

    auto it = map.constBegin();
    for (; it != map.constEnd(); ++it) {
        QDomNodePrivate *new_node = it.value()->cloneNode();
        new_node->setParent(pimpl);
        m->setNamedItem(new_node);
    }

    // we are no longer interested in ownership
    m->ref.deref();
    return m.release();
}